

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetStopTime(void *ida_mem,sunrealtype tstop)

{
  long in_RDI;
  IDAMem in_XMM0_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x16b,"IDASetStopTime",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if ((*(long *)(in_RDI + 0x5b8) < 1) ||
          (0.0 <= ((double)in_XMM0_Qa - *(double *)(in_RDI + 0x4f8)) * *(double *)(in_RDI + 0x4e0)))
  {
    *(IDAMem *)(in_RDI + 0x4b0) = in_XMM0_Qa;
    *(undefined4 *)(in_RDI + 0x4a8) = 1;
    local_4 = 0;
  }
  else {
    IDAProcessError(in_XMM0_Qa,*(int *)(in_RDI + 0x4f8),(int)in_RDI,(char *)0xffffffea,(char *)0x179
                    ,"IDASetStopTime",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,
                    "The value tstop = %.15g is behind current t = %.15gin the direction of integration."
                   );
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDASetStopTime(void* ida_mem, sunrealtype tstop)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* If IDASolve was called at least once, test if tstop is legal
   * (i.e. if it was not already passed).
   * If IDASetStopTime is called before the first call to IDASolve,
   * tstop will be checked in IDASolve. */
  if (IDA_mem->ida_nst > 0)
  {
    if ((tstop - IDA_mem->ida_tn) * IDA_mem->ida_hh < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_TSTOP, tstop, IDA_mem->ida_tn);
      return (IDA_ILL_INPUT);
    }
  }

  IDA_mem->ida_tstop    = tstop;
  IDA_mem->ida_tstopset = SUNTRUE;

  return (IDA_SUCCESS);
}